

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePrimalray4Row
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  pointer pnVar4;
  int iVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  if ((direction->m_backend).fpclass == cpp_dec_float_NaN) {
    uVar8 = 0;
    uVar9 = 0xbff00000;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_d8,0,(type *)0x0);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&direction->m_backend,&local_d8);
    uVar8 = (undefined4)*(undefined8 *)(&DAT_00601190 + (ulong)(0 < iVar5) * 8);
    uVar9 = (undefined4)((ulong)*(undefined8 *)(&DAT_00601190 + (ulong)(0 < iVar5) * 8) >> 0x20);
  }
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,(double)CONCAT44(uVar9,uVar8));
  (this->primalRay).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(&this->primalRay,(this->theCoPvec->thedelta).super_IdxSet.num);
  pUVar6 = this->theCoPvec;
  if (0 < (pUVar6->thedelta).super_IdxSet.num) {
    lVar7 = 0;
    do {
      piVar3 = (pUVar6->thedelta).super_IdxSet.idx;
      iVar5 = piVar3[lVar7];
      iVar2 = piVar3[lVar7];
      pnVar4 = (pUVar6->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x20);
      local_88.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x30);
      local_88.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = pnVar4[iVar2].m_backend.exp;
      local_88.neg = pnVar4[iVar2].m_backend.neg;
      local_88.fpclass = pnVar4[iVar2].m_backend.fpclass;
      local_88.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
      local_128.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
      local_128.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
      local_128.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
      local_128.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
      local_128.data._M_elems[8] = local_d8.data._M_elems[8];
      local_128.data._M_elems[9] = local_d8.data._M_elems[9];
      local_128.data._M_elems[10] = local_d8.data._M_elems[10];
      local_128.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
      local_128.data._M_elems[4] = local_d8.data._M_elems[4];
      local_128.data._M_elems[5] = local_d8.data._M_elems[5];
      local_128.data._M_elems[6] = local_d8.data._M_elems[6];
      local_128.data._M_elems[7] = local_d8.data._M_elems[7];
      local_128.data._M_elems[0] = local_d8.data._M_elems[0];
      local_128.data._M_elems[1] = local_d8.data._M_elems[1];
      local_128.data._M_elems[2] = local_d8.data._M_elems[2];
      local_128.data._M_elems[3] = local_d8.data._M_elems[3];
      local_128.exp = local_d8.exp;
      local_128.neg = local_d8.neg;
      local_128.fpclass = local_d8.fpclass;
      local_128.prec_elem = local_d8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_128,&local_88);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&this->primalRay,iVar5,
            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_128);
      lVar7 = lVar7 + 1;
      pUVar6 = this->theCoPvec;
    } while (lVar7 < (pUVar6->thedelta).super_IdxSet.num);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computePrimalray4Row(R direction)
{
   R sign = (direction > 0 ? 1.0 : -1.0);

   primalRay.clear();
   primalRay.setMax(coPvec().delta().size());

   for(int i = 0; i < coPvec().delta().size(); ++i)
      primalRay.add(coPvec().delta().index(i), sign * coPvec().delta().value(i));
}